

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::CoverCrossSymbol::visitExprs<xilinx_do_not_care_values::MainVisitor&>
          (CoverCrossSymbol *this,AlwaysFFVisitor *visitor)

{
  Expression *this_00;
  CoverageOptionSetter *opt;
  pointer this_01;
  long lVar1;
  
  this_00 = getIffExpr(this);
  if (this_00 != (Expression *)0x0) {
    Expression::visit<xilinx_do_not_care_values::MainVisitor&>(this_00,visitor);
  }
  this_01 = (this->options)._M_ptr;
  for (lVar1 = (this->options)._M_extent._M_extent_value * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18)
  {
    CoverageOptionSetter::visitExprs<xilinx_do_not_care_values::MainVisitor&>(this_01,visitor);
    this_01 = this_01 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (auto expr = getIffExpr())
            expr->visit(visitor);

        for (auto& opt : options)
            opt.visitExprs(visitor);
    }